

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O2

string * __thiscall
duckdb::DBConfig::UserAgent_abi_cxx11_(string *__return_storage_ptr__,DBConfig *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  GetDefaultUserAgent_abi_cxx11_();
  if ((this->options).duckdb_api._M_string_length != 0) {
    ::std::operator+(&local_30," ",&(this->options).duckdb_api);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->options).custom_user_agent._M_string_length != 0) {
    ::std::operator+(&local_30," ",&(this->options).custom_user_agent);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

const string DBConfig::UserAgent() const {
	auto user_agent = GetDefaultUserAgent();

	if (!options.duckdb_api.empty()) {
		user_agent += " " + options.duckdb_api;
	}

	if (!options.custom_user_agent.empty()) {
		user_agent += " " + options.custom_user_agent;
	}
	return user_agent;
}